

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_18;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      local_18 = (void *)nread;
      if (nread != -0xfff) goto LAB_001ce7c1;
      puts("GOT EOF");
      uv_close((uv_handle_t *)tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001ce7c1:
  handle = (uv_handle_t *)&stack0xffffffffffffffe8;
  read_cb_cold_1();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_PTR_EQ((uv_tcp_t*)stream, &tcp_accepted);
  if (nread < 0) {
    uv_close((uv_handle_t*) stream, NULL);
  } else {
    read_size += nread;
    if (read_size == 16 && client_close == 0)
      do_close(&tcp_accepted);
  }
}